

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semicircle.hpp
# Opt level: O2

bool __thiscall
boost::geometry::model::
semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>::
intersects_box<boost::geometry::model::box<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
          (semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
           *this,box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_> *b
          )

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_> local_38;
  
  bVar2 = intersects<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>,boost::geometry::model::box<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                    ((segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                      *)this,b);
  bVar3 = true;
  if (!bVar2) {
    local_38.
    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
    .first.m_values[0] = (b->m_min_corner).m_values[0];
    local_38.
    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
    .first.m_values[1] = (b->m_min_corner).m_values[1];
    local_38.
    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
    .second.m_values[1] = (b->m_max_corner).m_values[1];
    local_38.
    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
    .second.m_values[0] = (b->m_min_corner).m_values[0];
    bVar2 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                      (this,&local_38);
    bVar3 = true;
    if (!bVar2) {
      local_38.
      super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
      .first.m_values[0] = (b->m_max_corner).m_values[0];
      local_38.
      super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
      .first.m_values[1] = (b->m_max_corner).m_values[1];
      bVar2 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                        (this,&local_38);
      if (!bVar2) {
        auVar1 = *(undefined1 (*) [16])((b->m_min_corner).m_values + 1);
        local_38.
        super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
        .second.m_values[1]._0_4_ = auVar1._0_4_;
        local_38.
        super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
        .second.m_values[0] = (double)auVar1._8_8_;
        local_38.
        super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
        .second.m_values[1]._4_4_ = auVar1._4_4_;
        bVar2 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                          (this,&local_38);
        if (!bVar2) {
          local_38.
          super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
          .first.m_values[0] = (b->m_min_corner).m_values[0];
          local_38.
          super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
          .first.m_values[1] = (b->m_min_corner).m_values[1];
          bVar3 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                            (this,&local_38);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool intersects_box(Box const &b) const
    {
        if (geometry::intersects(s, b))
            return true;
        typedef typename point_type<Box>::type BoxPoint;
        typedef segment<BoxPoint> BoxSegment;
        BoxSegment bs(b.min_corner(),
                        BoxPoint(get<min_corner, 0>(b), get<max_corner, 1>(b)));
        if (intersects_segment(bs))
            return true;
        bs.first = b.max_corner();
        if (intersects_segment(bs))
            return true;
        set<0>(bs.second, get<max_corner, 0>(b));
        set<1>(bs.second, get<min_corner, 1>(b));
        if (intersects_segment(bs))
            return true;
        bs.first = b.min_corner();
        if (intersects_segment(bs))
            return true;
        return false;
    }